

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O2

bool __thiscall InliningDecider::InlineIntoInliner(InliningDecider *this,FunctionBody *inliner)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  LocalFunctionId LVar4;
  int iVar5;
  undefined4 *puVar6;
  DynamicProfileInfo *this_00;
  undefined4 extraout_var;
  char16 *pcVar7;
  char16_t *form;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  
  if (inliner == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0x2d,"(inliner)","inliner");
    if (!bVar2) goto LAB_00510ba1;
    *puVar6 = 0;
  }
  if (this->jitMode != FullJit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0x2e,"(this->jitMode == ExecutionMode::FullJit)",
                       "this->jitMode == ExecutionMode::FullJit");
    if (!bVar2) {
LAB_00510ba1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
  LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,InlinePhase,uVar3,LVar4);
  if (!bVar2) {
    uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
    LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,GlobOptPhase,uVar3,LVar4);
    if (!bVar2) {
      if ((inliner->dynamicProfileInfo).ptr == (DynamicProfileInfo *)0x0) {
        uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
        LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar3,LVar4);
        if (bVar2) {
          form = L"INLINING: Skip Inline: No dynamic profile info\tCaller: %s (%s)\n";
          goto LAB_00510b16;
        }
      }
      else {
        if (inliner->profiledCallSiteCount == 0) {
          this_00 = Js::FunctionBody::GetAnyDynamicProfileInfo(inliner);
          bVar2 = Js::DynamicProfileInfo::HasLdFldCallSiteInfo(this_00);
          if (!bVar2) {
            if (DAT_0145948a != '\x01') {
              return false;
            }
            uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
            LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
            bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar3,LVar4);
            if (!bVar2) {
              return false;
            }
            form = L"INLINING: Skip Inline: Leaf function\tCaller: %s (%s)\n";
            goto LAB_00510b16;
          }
        }
        Js::FunctionBody::GetAnyDynamicProfileInfo(inliner);
        bVar2 = Js::DynamicProfileInfo::HasCallSiteInfo(inliner);
        if (bVar2) {
          return true;
        }
        uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
        LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar3,LVar4);
        if (bVar2) {
          form = L"INLINING: Skip Inline: No call site info\tCaller: %s (#%d)\n";
LAB_00510b16:
          iVar5 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[7])(inliner);
          pcVar7 = Js::FunctionProxy::GetDebugNumberSet
                             ((FunctionProxy *)inliner,(wchar (*) [42])local_88);
          Output::Print(form,CONCAT44(extraout_var,iVar5),pcVar7);
          Output::Flush();
          return false;
        }
      }
    }
  }
  return false;
}

Assistant:

bool InliningDecider::InlineIntoInliner(Js::FunctionBody *const inliner) const
{
    Assert(inliner);
    Assert(this->jitMode == ExecutionMode::FullJit);

#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

    if (PHASE_OFF(Js::InlinePhase, inliner) ||
        PHASE_OFF(Js::GlobOptPhase, inliner))
    {
        return false;
    }

    if (!inliner->HasDynamicProfileInfo())
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: No dynamic profile info\tCaller: %s (%s)\n"), inliner->GetDisplayName(),
            inliner->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    if (inliner->GetProfiledCallSiteCount() == 0 && !inliner->GetAnyDynamicProfileInfo()->HasLdFldCallSiteInfo())
    {
        INLINE_TESTTRACE_VERBOSE(_u("INLINING: Skip Inline: Leaf function\tCaller: %s (%s)\n"), inliner->GetDisplayName(),
            inliner->GetDebugNumberSet(debugStringBuffer));
        // Nothing to do
        return false;
    }

    if (!inliner->GetAnyDynamicProfileInfo()->HasCallSiteInfo(inliner))
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: No call site info\tCaller: %s (#%d)\n"), inliner->GetDisplayName(),
            inliner->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    return true;
}